

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O0

int __thiscall bhf::ads::LicenseAccess::ShowOnlineInfo(LicenseAccess *this,ostream *os)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  ulong __n;
  size_type sVar6;
  TcLicenseOnlineInfo *buffer;
  string local_a88 [32];
  stringstream local_a68 [8];
  stringstream stream_5;
  ostream local_a58 [376];
  string local_8e0 [32];
  stringstream local_8c0 [8];
  stringstream stream_4;
  ostream local_8b0 [376];
  reference local_738;
  TcLicenseOnlineInfo *next;
  iterator __end2;
  iterator __begin2;
  vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_> *__range2;
  stringstream local_6f8 [8];
  stringstream stream_3;
  ostream local_6e8 [380];
  undefined4 local_56c;
  string local_568 [32];
  stringstream local_548 [8];
  stringstream stream_2;
  ostream local_538 [376];
  long local_3c0;
  long status;
  unsigned_long bufferSize;
  undefined1 local_3a8 [8];
  vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_> readBuffer;
  stringstream local_370 [8];
  stringstream stream_1;
  ostream local_360 [376];
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream stream;
  ostream local_1a8 [376];
  long local_30;
  long countStatus;
  uint32_t bytesRead;
  uint32_t licenseCount;
  ostream *os_local;
  LicenseAccess *this_local;
  
  countStatus._4_4_ = 0;
  countStatus._0_4_ = 0;
  _bytesRead = os;
  os_local = (ostream *)this;
  local_30 = AdsDevice::ReadReqEx2
                       (&this->device,0x1010006,0,4,(void *)((long)&countStatus + 4),
                        (uint32_t *)&countStatus);
  if (local_30 == 0) {
    countStatus._4_4_ = letoh<unsigned_int>((uint *)((long)&countStatus + 4));
    if (countStatus._4_4_ == 0) {
      std::__cxx11::stringstream::stringstream(local_370);
      poVar4 = std::operator<<(local_360,"ShowOnlineInfo");
      std::operator<<(poVar4,"(): no license available\n");
      std::__cxx11::stringstream::str();
      Logger::Log(2,(string *)
                    &readBuffer.
                     super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &readBuffer.
                  super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::stringstream::~stringstream(local_370);
      this_local._4_4_ = 0;
    }
    else {
      __n = (ulong)countStatus._4_4_;
      std::allocator<bhf::ads::TcLicenseOnlineInfo>::allocator
                ((allocator<bhf::ads::TcLicenseOnlineInfo> *)((long)&bufferSize + 7));
      std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>::
      vector((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
              *)local_3a8,__n,(allocator<bhf::ads::TcLicenseOnlineInfo> *)((long)&bufferSize + 7));
      std::allocator<bhf::ads::TcLicenseOnlineInfo>::~allocator
                ((allocator<bhf::ads::TcLicenseOnlineInfo> *)((long)&bufferSize + 7));
      sVar6 = std::
              vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
              ::capacity((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                          *)local_3a8);
      status = sVar6 * 0x30;
      buffer = std::
               vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
               ::data((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                       *)local_3a8);
      local_3c0 = AdsDevice::ReadReqEx2
                            (&this->device,0x1010006,0,sVar6 * 0x30,buffer,(uint32_t *)&countStatus)
      ;
      if (local_3c0 == 0) {
        if (status == (ulong)(uint)countStatus) {
          std::operator<<(_bytesRead,"OrderNo.;Instances;Status;License\n");
          __end2 = std::
                   vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                   ::begin((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                            *)local_3a8);
          next = (TcLicenseOnlineInfo *)
                 std::
                 vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                 ::end((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                        *)local_3a8);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end2,(__normal_iterator<bhf::ads::TcLicenseOnlineInfo_*,_std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>_>
                                        *)&next);
            if (!bVar1) break;
            local_738 = __gnu_cxx::
                        __normal_iterator<bhf::ads::TcLicenseOnlineInfo_*,_std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>_>
                        ::operator*(&__end2);
            iVar3 = TcLicenseOnlineInfo::ShowOrderNo(local_738,_bytesRead,&this->device);
            if (iVar3 != 0) {
              std::__cxx11::stringstream::stringstream(local_8c0);
              poVar4 = std::operator<<(local_8b0,"ShowOnlineInfo");
              poVar4 = std::operator<<(poVar4,"(): reading order number failed with: 0x");
              pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
              poVar4 = (ostream *)std::ostream::operator<<(pvVar5,local_3c0);
              std::operator<<(poVar4,'\n');
              std::__cxx11::stringstream::str();
              Logger::Log(3,local_8e0);
              std::__cxx11::string::~string((string *)local_8e0);
              std::__cxx11::stringstream::~stringstream(local_8c0);
              this_local._4_4_ = 1;
              goto LAB_0017592e;
            }
            std::operator<<(_bytesRead,';');
            poVar4 = TcLicenseOnlineInfo::ShowInstances(local_738,_bytesRead);
            std::operator<<(poVar4,';');
            poVar4 = TcLicenseOnlineInfo::ShowStatus(local_738,_bytesRead);
            std::operator<<(poVar4,';');
            iVar3 = TcLicenseOnlineInfo::ShowName(local_738,_bytesRead,&this->device);
            if (iVar3 != 0) {
              std::__cxx11::stringstream::stringstream(local_a68);
              poVar4 = std::operator<<(local_a58,"ShowOnlineInfo");
              poVar4 = std::operator<<(poVar4,"(): reading license name failed with: 0x");
              pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
              poVar4 = (ostream *)std::ostream::operator<<(pvVar5,local_3c0);
              std::operator<<(poVar4,'\n');
              std::__cxx11::stringstream::str();
              Logger::Log(3,local_a88);
              std::__cxx11::string::~string((string *)local_a88);
              std::__cxx11::stringstream::~stringstream(local_a68);
              this_local._4_4_ = 1;
              goto LAB_0017592e;
            }
            std::operator<<(_bytesRead,'\n');
            __gnu_cxx::
            __normal_iterator<bhf::ads::TcLicenseOnlineInfo_*,_std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>_>
            ::operator++(&__end2);
          }
          bVar2 = std::ios::good();
          this_local._4_4_ = (uint)((bVar2 ^ 0xff) & 1);
        }
        else {
          std::__cxx11::stringstream::stringstream(local_6f8);
          poVar4 = std::operator<<(local_6e8,"ShowOnlineInfo");
          poVar4 = std::operator<<(poVar4,"(): read unexpected number of bytes: 0x");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(uint)countStatus);
          poVar4 = std::operator<<(poVar4,", expected: 0x");
          sVar6 = std::
                  vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                  ::capacity((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                              *)local_3a8);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
          std::operator<<(poVar4,'\n');
          std::__cxx11::stringstream::str();
          Logger::Log(3,(string *)&__range2);
          std::__cxx11::string::~string((string *)&__range2);
          std::__cxx11::stringstream::~stringstream(local_6f8);
          this_local._4_4_ = 1;
        }
      }
      else {
        std::__cxx11::stringstream::stringstream(local_548);
        poVar4 = std::operator<<(local_538,"ShowOnlineInfo");
        poVar4 = std::operator<<(poVar4,"(): failed with: 0x");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar5,local_3c0);
        std::operator<<(poVar4,'\n');
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_568);
        std::__cxx11::string::~string((string *)local_568);
        std::__cxx11::stringstream::~stringstream(local_548);
        this_local._4_4_ = 1;
      }
LAB_0017592e:
      local_56c = 1;
      std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>::
      ~vector((vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
               *)local_3a8);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::operator<<(local_1a8,"ShowOnlineInfo");
    poVar4 = std::operator<<(poVar4,"(): read license count failed with: 0x");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,local_30);
    std::operator<<(poVar4,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int LicenseAccess::ShowOnlineInfo(std::ostream& os) const
{
    uint32_t licenseCount = 0;
    uint32_t bytesRead = 0;
    const auto countStatus = device.ReadReqEx2(0x01010006,
                                               0x0,
                                               sizeof(licenseCount),
                                               &licenseCount,
                                               &bytesRead);
    if (ADSERR_NOERR != countStatus) {
        LOG_ERROR(__FUNCTION__ << "(): read license count failed with: 0x" << std::hex << countStatus << '\n');
        return 1;
    }

    licenseCount = bhf::ads::letoh(licenseCount);
    if (0 == licenseCount) {
        LOG_WARN(__FUNCTION__ << "(): no license available\n");
        return 0;
    }

    auto readBuffer = std::vector<TcLicenseOnlineInfo>(licenseCount);
    const auto bufferSize = sizeof(readBuffer[0]) * readBuffer.capacity();
    const auto status = device.ReadReqEx2(0x01010006,
                                          0x0,
                                          bufferSize,
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return 1;
    }

    if (bufferSize != bytesRead) {
        LOG_ERROR(
            __FUNCTION__ << "(): read unexpected number of bytes: 0x" << std::hex << bytesRead << ", expected: 0x" << readBuffer.capacity() <<
                '\n');
        return 1;
    }

    os << "OrderNo.;Instances;Status;License\n";
    for (const auto& next: readBuffer) {
        if (next.ShowOrderNo(os, device)) {
            LOG_ERROR(__FUNCTION__ << "(): reading order number failed with: 0x" << std::hex << status << '\n');
            return 1;
        }

        os << ';';
        next.ShowInstances(os) << ';';
        next.ShowStatus(os) << ';';
        if (next.ShowName(os, device)) {
            LOG_ERROR(__FUNCTION__ << "(): reading license name failed with: 0x" << std::hex << status << '\n');
            return 1;
        }
        os << '\n';
    }
    return !os.good();
}